

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

void free_sconv_object(archive_string_conv *sc)

{
  free(sc->from_charset);
  free(sc->to_charset);
  (sc->utftmp).length = 0;
  (sc->utftmp).buffer_length = 0;
  free((sc->utftmp).s);
  (sc->utftmp).s = (char *)0x0;
  if (sc->cd != (iconv_t)0xffffffffffffffff) {
    iconv_close(sc->cd);
  }
  if (sc->cd_w != (iconv_t)0xffffffffffffffff) {
    iconv_close(sc->cd_w);
  }
  free(sc);
  return;
}

Assistant:

static void
free_sconv_object(struct archive_string_conv *sc)
{
	free(sc->from_charset);
	free(sc->to_charset);
	archive_string_free(&sc->utftmp);
#if HAVE_ICONV
	if (sc->cd != (iconv_t)-1)
		iconv_close(sc->cd);
	if (sc->cd_w != (iconv_t)-1)
		iconv_close(sc->cd_w);
#endif
	free(sc);
}